

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_storevar(FuncState *fs,expdesc *var,expdesc *ex)

{
  expkind eVar1;
  uint a;
  int c;
  int b;
  OpCode o;
  
  eVar1 = var->k;
  if (eVar1 == VINDEXED) {
    o = (uint)((var->u).ind.vt == '\b') * 2 + OP_SETTABUP;
    c = luaK_exp2RK(fs,ex);
    a = (uint)(var->u).ind.t;
    b = (int)(var->u).ind.idx;
  }
  else {
    if (eVar1 != VUPVAL) {
      if (eVar1 == VLOCAL) {
        freeexp(fs,ex);
        exp2reg(fs,ex,(var->u).info);
        return;
      }
      goto LAB_001143c7;
    }
    a = luaK_exp2anyreg(fs,ex);
    b = (var->u).info;
    o = OP_SETUPVAL;
    c = 0;
  }
  luaK_codeABC(fs,o,a,b,c);
LAB_001143c7:
  freeexp(fs,ex);
  return;
}

Assistant:

void luaK_storevar(FuncState *fs, expdesc *var, expdesc *ex) {
    switch (var->k) {
        case VLOCAL: {
            freeexp(fs, ex);
            exp2reg(fs, ex, var->u.info);  /* compute 'ex' into proper place */
            return;
        }
        case VUPVAL: {
            int e = luaK_exp2anyreg(fs, ex);
            luaK_codeABC(fs, OP_SETUPVAL, e, var->u.info, 0);
            break;
        }
        case VINDEXED: {
            OpCode op = (var->u.ind.vt == VLOCAL) ? OP_SETTABLE : OP_SETTABUP;
            int e = luaK_exp2RK(fs, ex);
            luaK_codeABC(fs, op, var->u.ind.t, var->u.ind.idx, e);
            break;
        }
        default:
            lua_assert(0);  /* invalid var kind to store */
    }
    freeexp(fs, ex);
}